

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_test.c
# Opt level: O1

void test_resize(void)

{
  nng_err nVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  nng_err result_;
  nng_err result__1;
  undefined4 *val;
  uint64_t uVar5;
  undefined4 local_1068 [2];
  int expect [1024];
  nni_id_map m;
  
  lVar3 = 0;
  do {
    local_1068[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x400);
  nni_id_map_init((nni_id_map *)(expect + 0x3fe),0,0,false);
  val = local_1068;
  uVar5 = 0;
  do {
    nVar1 = nni_id_set((nni_id_map *)(expect + 0x3fe),uVar5,val);
    if (nVar1 != NNG_OK) {
      pcVar4 = nng_strerror(nVar1);
      iVar2 = acutest_check_(0,
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                             ,0x7b,"%s: expected success, got %s (%d)","rv",pcVar4,nVar1);
      if (iVar2 == 0) goto LAB_0010c3ad;
    }
    uVar5 = uVar5 + 1;
    val = val + 1;
  } while (uVar5 != 0x400);
  uVar5 = 0;
  do {
    nVar1 = nni_id_remove((nni_id_map *)(expect + 0x3fe),uVar5);
    if (nVar1 != NNG_OK) {
      pcVar4 = nng_strerror(nVar1);
      iVar2 = acutest_check_(0,
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                             ,0x81,"%s: expected success, got %s (%d)","rv",pcVar4,nVar1);
      if (iVar2 == 0) {
LAB_0010c3ad:
        acutest_abort_();
      }
    }
    uVar5 = uVar5 + 1;
    if (uVar5 == 0x400) {
      nni_id_map_fini((nni_id_map *)(expect + 0x3fe));
      return;
    }
  } while( true );
}

Assistant:

void
test_resize(void)
{
	nni_id_map m;
	int        rv;
	int        i;
	int        expect[1024];

	for (i = 0; i < 1024; i++) {
		expect[i] = i;
	}

	nni_id_map_init(&m, 0, 0, false);

	for (i = 0; i < 1024; i++) {
		if ((rv = nni_id_set(&m, i, &expect[i])) != 0) {
			NUTS_PASS(rv);
		}
	}

	for (i = 0; i < 1024; i++) {
		if ((rv = nni_id_remove(&m, i)) != 0) {
			NUTS_PASS(rv);
		}
	}
	nni_id_map_fini(&m);
}